

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amount_tests.cpp
# Opt level: O0

void __thiscall amount_tests::ToStringTest::test_method(ToStringTest *this)

{
  bool bVar1;
  long in_FS_OFFSET;
  CFeeRate feeRate;
  char *in_stack_fffffffffffffdc8;
  char *in_stack_fffffffffffffdd0;
  char *in_stack_fffffffffffffdd8;
  CFeeRate *in_stack_fffffffffffffde0;
  const_string *in_stack_fffffffffffffdf0;
  const_string *msg;
  size_t in_stack_fffffffffffffdf8;
  undefined1 *line_num;
  const_string *in_stack_fffffffffffffe00;
  char *file;
  unit_test_log_t *in_stack_fffffffffffffe08;
  unit_test_log_t *this_00;
  undefined1 local_178 [16];
  undefined1 local_168 [32];
  undefined1 local_148 [16];
  const_string local_138;
  undefined4 local_124;
  undefined1 local_120 [16];
  undefined1 local_110 [68];
  undefined4 local_cc;
  undefined1 local_c8 [16];
  undefined1 local_b8 [64];
  undefined8 local_78;
  undefined8 local_70;
  undefined1 local_68 [32];
  undefined1 local_48 [32];
  undefined1 local_28 [32];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  CFeeRate::CFeeRate((CFeeRate *)in_stack_fffffffffffffdc8);
  CFeeRate::CFeeRate<int>((CFeeRate *)in_stack_fffffffffffffdc8,0);
  local_70 = local_78;
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0,
               (unsigned_long)in_stack_fffffffffffffdc8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffdc8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffffe08,in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,
               in_stack_fffffffffffffdf0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffffdd0,(char (*) [1])in_stack_fffffffffffffdc8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0,
               (unsigned_long)in_stack_fffffffffffffdc8);
    local_cc = 3;
    CFeeRate::ToString_abi_cxx11_
              (in_stack_fffffffffffffde0,(FeeEstimateMode *)in_stack_fffffffffffffdd8);
    in_stack_fffffffffffffdd8 = "\"0.00000001 BTC/kvB\"";
    in_stack_fffffffffffffdd0 = "0.00000001 BTC/kvB";
    in_stack_fffffffffffffdc8 = "feeRate.ToString()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[19]>
              (local_b8,local_c8,0x89,1,2,local_28);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffdc8);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffffdc8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0,
               (unsigned_long)in_stack_fffffffffffffdc8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffdc8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffffe08,in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,
               in_stack_fffffffffffffdf0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffffdd0,(char (*) [1])in_stack_fffffffffffffdc8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0,
               (unsigned_long)in_stack_fffffffffffffdc8);
    local_124 = 3;
    CFeeRate::ToString_abi_cxx11_
              (in_stack_fffffffffffffde0,(FeeEstimateMode *)in_stack_fffffffffffffdd8);
    in_stack_fffffffffffffdd8 = "\"0.00000001 BTC/kvB\"";
    in_stack_fffffffffffffdd0 = "0.00000001 BTC/kvB";
    in_stack_fffffffffffffdc8 = "feeRate.ToString(FeeEstimateMode::BTC_KVB)";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[19]>
              (local_110,local_120,0x8a,1,2,local_48);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffdc8);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffffdc8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    file = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/amount_tests.cpp"
    ;
    msg = &local_138;
    this_00 = (unit_test_log_t *)0x65;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0,
               (unsigned_long)in_stack_fffffffffffffdc8);
    line_num = local_148;
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffdc8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (this_00,(const_string *)file,(size_t)line_num,msg);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffffdd0,(char (*) [1])in_stack_fffffffffffffdc8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0,
               (unsigned_long)in_stack_fffffffffffffdc8);
    CFeeRate::ToString_abi_cxx11_
              (in_stack_fffffffffffffde0,(FeeEstimateMode *)in_stack_fffffffffffffdd8);
    in_stack_fffffffffffffdd8 = "\"0.001 sat/vB\"";
    in_stack_fffffffffffffdd0 = "0.001 sat/vB";
    in_stack_fffffffffffffdc8 = "feeRate.ToString(FeeEstimateMode::SAT_VB)";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[13]>
              (local_168,local_178,0x8b,1,2,local_68);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffdc8);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffffdc8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(ToStringTest)
{
    CFeeRate feeRate;
    feeRate = CFeeRate(1);
    BOOST_CHECK_EQUAL(feeRate.ToString(), "0.00000001 BTC/kvB");
    BOOST_CHECK_EQUAL(feeRate.ToString(FeeEstimateMode::BTC_KVB), "0.00000001 BTC/kvB");
    BOOST_CHECK_EQUAL(feeRate.ToString(FeeEstimateMode::SAT_VB), "0.001 sat/vB");
}